

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorSet::FileDescriptorSet
          (FileDescriptorSet *this,FileDescriptorSet *from)

{
  Rep *pRVar1;
  void *pvVar2;
  void **our_elems;
  int iVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorSet_006822c0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->file_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->file_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar3 = (from->file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    pRVar1 = (from->file_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->file_).super_RepeatedPtrFieldBase,iVar3);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
              (&(this->file_).super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,iVar3,
               ((this->file_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->file_).super_RepeatedPtrFieldBase.current_size_);
    iVar3 = iVar3 + (this->file_).super_RepeatedPtrFieldBase.current_size_;
    (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar3;
    pRVar1 = (this->file_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar3) {
      pRVar1->allocated_size = iVar3;
    }
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

FileDescriptorSet::FileDescriptorSet(const FileDescriptorSet& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      file_(from.file_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileDescriptorSet)
}